

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int bid_keycmp(char *p,char *key,ssize_t len)

{
  bool bVar1;
  int local_2c;
  ssize_t sStack_28;
  int match_len;
  ssize_t len_local;
  char *key_local;
  char *p_local;
  
  local_2c = 0;
  sStack_28 = len;
  len_local = (ssize_t)key;
  key_local = p;
  while( true ) {
    bVar1 = false;
    if ((0 < sStack_28) && (bVar1 = false, *key_local != '\0')) {
      bVar1 = *(char *)len_local != '\0';
    }
    if (!bVar1) break;
    if (*key_local != *(char *)len_local) {
      return 0;
    }
    sStack_28 = sStack_28 + -1;
    key_local = key_local + 1;
    len_local = len_local + 1;
    local_2c = local_2c + 1;
  }
  if (*(char *)len_local != '\0') {
    return 0;
  }
  if (((((*key_local != '=') && (*key_local != ' ')) && (*key_local != '\t')) &&
      ((*key_local != '\n' && (*key_local != '\r')))) &&
     ((*key_local != '\\' || ((key_local[1] != '\n' && (key_local[1] != '\r')))))) {
    return 0;
  }
  return local_2c;
}

Assistant:

static int
bid_keycmp(const char *p, const char *key, ssize_t len)
{
	int match_len = 0;

	while (len > 0 && *p && *key) {
		if (*p == *key) {
			--len;
			++p;
			++key;
			++match_len;
			continue;
		}
		return (0);/* Not match */
	}
	if (*key != '\0')
		return (0);/* Not match */

	/* A following character should be specified characters */
	if (p[0] == '=' || p[0] == ' ' || p[0] == '\t' ||
	    p[0] == '\n' || p[0] == '\r' ||
	   (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r')))
		return (match_len);
	return (0);/* Not match */
}